

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

void flatbuffers::Print<void_const*>
               (void *val,Type type,int indent,int indent_step,StructDef *union_sd,string *_text)

{
  byte i;
  Type type_00;
  Type type_01;
  Type type_02;
  Type type_03;
  Type type_04;
  Type type_05;
  Type type_06;
  Type type_07;
  Type type_08;
  Type type_09;
  Type type_10;
  long *plVar1;
  long *plVar2;
  ulong uVar3;
  long *local_70;
  long local_60;
  long lStack_58;
  string local_50;
  
  switch(type.base_type) {
  case BASE_TYPE_STRING:
    std::__cxx11::string::append((char *)_text);
    if (*val != 0) {
      uVar3 = 0;
      do {
        i = *(byte *)((long)val + uVar3 + 4);
        if (i < 0xd) {
          if ((i != 9) && (i != 10)) goto LAB_0011ab51;
LAB_0011ab3c:
          std::__cxx11::string::append((char *)_text);
        }
        else {
          if ((i == 0xd) || ((i == 0x22 || (i == 0x5c)))) goto LAB_0011ab3c;
LAB_0011ab51:
          if ((byte)(i - 0x20) < 0x5f) {
            std::__cxx11::string::push_back((char)_text);
          }
          else {
            IntToStringHex<unsigned_char>(&local_50,i);
            plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x120bdf);
            local_70 = &local_60;
            plVar2 = plVar1 + 2;
            if ((long *)*plVar1 == plVar2) {
              local_60 = *plVar2;
              lStack_58 = plVar1[3];
            }
            else {
              local_60 = *plVar2;
              local_70 = (long *)*plVar1;
            }
            *plVar1 = (long)plVar2;
            plVar1[1] = 0;
            *(undefined1 *)(plVar1 + 2) = 0;
            std::__cxx11::string::_M_append((char *)_text,(ulong)local_70);
            if (local_70 != &local_60) {
              operator_delete(local_70);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < *val);
    }
    std::__cxx11::string::append((char *)_text);
    break;
  case BASE_TYPE_VECTOR:
    switch(type.element) {
    case BASE_TYPE_NONE:
    case BASE_TYPE_UTYPE:
    case BASE_TYPE_BOOL:
    case BASE_TYPE_UCHAR:
      type_00.element = BASE_TYPE_NONE;
      type_00.base_type = type.element;
      type_00.struct_def = type.struct_def;
      type_00.enum_def = (EnumDef *)0x0;
      PrintVector<unsigned_char>((Vector<unsigned_char> *)val,type_00,indent,indent_step,_text);
      return;
    case BASE_TYPE_CHAR:
      type_03.element = BASE_TYPE_NONE;
      type_03.base_type = type.element;
      type_03.struct_def = type.struct_def;
      type_03.enum_def = (EnumDef *)0x0;
      PrintVector<signed_char>((Vector<signed_char> *)val,type_03,indent,indent_step,_text);
      return;
    case BASE_TYPE_SHORT:
      type_07.element = BASE_TYPE_NONE;
      type_07.base_type = type.element;
      type_07.struct_def = type.struct_def;
      type_07.enum_def = (EnumDef *)0x0;
      PrintVector<short>((Vector<short> *)val,type_07,indent,indent_step,_text);
      return;
    case BASE_TYPE_USHORT:
      type_08.element = BASE_TYPE_NONE;
      type_08.base_type = type.element;
      type_08.struct_def = type.struct_def;
      type_08.enum_def = (EnumDef *)0x0;
      PrintVector<unsigned_short>((Vector<unsigned_short> *)val,type_08,indent,indent_step,_text);
      return;
    case BASE_TYPE_INT:
      type_06.element = BASE_TYPE_NONE;
      type_06.base_type = type.element;
      type_06.struct_def = type.struct_def;
      type_06.enum_def = (EnumDef *)0x0;
      PrintVector<int>((Vector<int> *)val,type_06,indent,indent_step,_text);
      return;
    case BASE_TYPE_UINT:
      type_10.element = BASE_TYPE_NONE;
      type_10.base_type = type.element;
      type_10.struct_def = type.struct_def;
      type_10.enum_def = (EnumDef *)0x0;
      PrintVector<unsigned_int>((Vector<unsigned_int> *)val,type_10,indent,indent_step,_text);
      return;
    case BASE_TYPE_LONG:
      type_05.element = BASE_TYPE_NONE;
      type_05.base_type = type.element;
      type_05.struct_def = type.struct_def;
      type_05.enum_def = (EnumDef *)0x0;
      PrintVector<long>((Vector<long> *)val,type_05,indent,indent_step,_text);
      return;
    case BASE_TYPE_ULONG:
      type_09.element = BASE_TYPE_NONE;
      type_09.base_type = type.element;
      type_09.struct_def = type.struct_def;
      type_09.enum_def = (EnumDef *)0x0;
      PrintVector<unsigned_long>((Vector<unsigned_long> *)val,type_09,indent,indent_step,_text);
      return;
    case BASE_TYPE_FLOAT:
      type_02.element = BASE_TYPE_NONE;
      type_02.base_type = type.element;
      type_02.struct_def = type.struct_def;
      type_02.enum_def = (EnumDef *)0x0;
      PrintVector<float>((Vector<float> *)val,type_02,indent,indent_step,_text);
      return;
    case BASE_TYPE_DOUBLE:
      type_04.element = BASE_TYPE_NONE;
      type_04.base_type = type.element;
      type_04.struct_def = type.struct_def;
      type_04.enum_def = (EnumDef *)0x0;
      PrintVector<double>((Vector<double> *)val,type_04,indent,indent_step,_text);
      return;
    case BASE_TYPE_STRING:
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_STRUCT:
    case BASE_TYPE_UNION:
      type_01.element = BASE_TYPE_NONE;
      type_01.base_type = type.element;
      type_01.struct_def = type.struct_def;
      type_01.enum_def = (EnumDef *)0x0;
      PrintVector<flatbuffers::Offset<void>>
                ((Vector<flatbuffers::Offset<void>_> *)val,type_01,indent,indent_step,_text);
      return;
    }
    break;
  case BASE_TYPE_STRUCT:
    goto LAB_0011ac3a;
  case BASE_TYPE_UNION:
    type.struct_def = union_sd;
    if (union_sd == (StructDef *)0x0) {
      __assert_fail("union_sd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_gen_text.cpp"
                    ,99,
                    "void flatbuffers::Print(const void *, Type, int, int, StructDef *, std::string *)"
                   );
    }
LAB_0011ac3a:
    GenStruct(type.struct_def,(Table *)val,indent,indent_step,_text);
    return;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_gen_text.cpp"
                  ,0x82,
                  "void flatbuffers::Print(const void *, Type, int, int, StructDef *, std::string *)"
                 );
  }
  return;
}

Assistant:

void Print<const void *>(const void *val,
                                    Type type, int indent, int indent_step,
                                    StructDef *union_sd, std::string *_text) {
  switch (type.base_type) {
    case BASE_TYPE_UNION:
      // If this assert hits, you have an corrupt buffer, a union type field
      // was not present or was out of range.
      assert(union_sd);
      GenStruct(*union_sd,
                reinterpret_cast<const Table *>(val),
                indent,
                indent_step,
                _text);
      break;
    case BASE_TYPE_STRUCT:
      GenStruct(*type.struct_def,
                reinterpret_cast<const Table *>(val),
                indent,
                indent_step,
                _text);
      break;
    case BASE_TYPE_STRING: {
      EscapeString(*reinterpret_cast<const String *>(val), _text);
      break;
    }
    case BASE_TYPE_VECTOR:
      type = type.VectorType();
      // Call PrintVector above specifically for each element type:
      switch (type.base_type) {
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
          case BASE_TYPE_ ## ENUM: \
            PrintVector<CTYPE>( \
              *reinterpret_cast<const Vector<CTYPE> *>(val), \
              type, indent, indent_step, _text); break;
          FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
      }
      break;
    default: assert(0);
  }
}